

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O2

QRgba64 __thiscall QColorTransform::map(QColorTransform *this,QRgba64 rgba64)

{
  QColorTransformPrivate *this_00;
  float extraout_XMM0_Dd;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  QColorVector QVar3;
  
  this_00 = (this->d).d.ptr;
  if (this_00 != (QColorTransformPrivate *)0x0) {
    QVar3.x = (float)(ushort)rgba64.rgba * 1.5259022e-05;
    QVar3.y = (float)(ushort)(rgba64.rgba >> 0x10) * 1.5259022e-05;
    auVar2._4_12_ = SUB1612((undefined1  [16])0x0,4);
    auVar2._0_4_ = (float)((uint)(rgba64.rgba >> 0x20) & 0xffff) * 1.5259022e-05;
    QVar3._8_8_ = auVar2._0_8_;
    QVar3 = QColorTransformPrivate::map(this_00,QVar3);
    auVar1._0_4_ = (int)(QVar3.y * 65535.0 + 0.5);
    auVar1._4_4_ = (int)(QVar3.z * 65535.0 + 0.5);
    auVar1._12_4_ = (int)(extraout_XMM0_Dd * 0.0 + 0.0);
    auVar1._8_4_ = auVar1._4_4_;
    rgba64.rgba = (ulong)SUB164(auVar1 & _DAT_005e8420,8) << 0x20 |
                  SUB168(auVar1 & _DAT_005e8420,0) << 0x10 |
                  (ulong)((int)(QVar3.x * 65535.0 + 0.5) & 0xffff) |
                  rgba64.rgba & 0xffff000000000000;
  }
  return (QRgba64)rgba64.rgba;
}

Assistant:

QRgba64 QColorTransform::map(QRgba64 rgba64) const
{
    if (!d)
        return rgba64;
    constexpr float f = 1.0f / 65535.0f;
    QColorVector c = { rgba64.red() * f, rgba64.green() * f, rgba64.blue() * f };
    c = d->map(c);
    return QRgba64::fromRgba64(c.x * 65535.f + 0.5f, c.y * 65535.f + 0.5f, c.z * 65535.f + 0.5f, rgba64.alpha());
}